

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O2

value value_container(void *data)

{
  return data;
}

Assistant:

value value_container(void *data)
{
	if (data == NULL)
	{
		return NULL;
	}

	/* Right now the memory layout is designed in a way that
	* the first byte of the value is the data itself, so returning
	* the data as (value) has the same effect as container_of(data, struct value, data)
	*/
	return (value)data;
}